

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.hpp
# Opt level: O0

void nestl::test::
     CheckSetSize<nestl::impl::set<int,std::less<int>,nestl::test::minimal_allocator<int>>>
               (set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *s,
               size_t expectedSize)

{
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  size_type local_48;
  size_t cdist;
  rb_tree_const_iterator<int> local_38;
  size_type local_30;
  size_t dist;
  bool setIsEmpty;
  size_type sStack_20;
  bool shouldBeEmpty;
  size_type local_18;
  size_t expectedSize_local;
  set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *s_local;
  
  local_18 = expectedSize;
  expectedSize_local = (size_t)s;
  sVar1 = impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::size(s);
  if (sVar1 != local_18) {
    sStack_20 = impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::size
                          ((set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *)
                           expectedSize_local);
    fatal_failure<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((char (*) [16])"expected size: ",&local_18,(char (*) [8])", got: ",
               &stack0xffffffffffffffe0);
  }
  dist._7_1_ = local_18 == 0;
  dist._6_1_ = impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::empty
                         ((set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *)
                          expectedSize_local);
  if (dist._6_1_ != (dist._7_1_ & 1)) {
    fatal_failure<char_const(&)[26],bool&,char_const(&)[22],bool&>
              ((char (*) [26])"set empty method returns ",(bool *)((long)&dist + 6),
               (char (*) [22])", while it should be ",(bool *)((long)&dist + 7));
  }
  local_38.m_node =
       (base_ptr)
       impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::begin
                 ((set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *)
                  expectedSize_local);
  cdist = (size_t)impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::end
                            ((set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *)
                             expectedSize_local);
  local_30 = std::distance<nestl::impl::detail::rb_tree_const_iterator<int>>
                       (local_38,(rb_tree_const_iterator<int>)cdist);
  if (local_30 != local_18) {
    fatal_failure<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [38])"distance between iterators should be ",&local_18,
               (char (*) [16])" elements, got ",&local_30,(char (*) [10])" elements");
  }
  __first = impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::cbegin
                      ((set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *)
                       expectedSize_local);
  __last = impl::set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_>::cend
                     ((set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *)
                      expectedSize_local);
  local_48 = std::distance<nestl::impl::detail::rb_tree_const_iterator<int>>
                       ((rb_tree_const_iterator<int>)__first.m_node,
                        (rb_tree_const_iterator<int>)__last.m_node);
  if (local_48 != local_18) {
    fatal_failure<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [44])"distance between const iterators should be ",&local_18,
               (char (*) [16])" elements, got ",&local_48,(char (*) [10])" elements");
  }
  return;
}

Assistant:

void CheckSetSize(const Set& s, size_t expectedSize)
{
    if (s.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", s.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool setIsEmpty = s.empty();

    if (setIsEmpty != shouldBeEmpty)
    {
        fatal_failure("set empty method returns ", setIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(s.begin(), s.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(s.cbegin(), s.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be " ,expectedSize, " elements, got ", cdist, " elements");
    }
}